

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.cpp
# Opt level: O0

size_t __thiscall cali::Entry::pack(Entry *this,uchar *buffer)

{
  cali_id_t cVar1;
  size_t sVar2;
  size_t local_20;
  size_t pos;
  uchar *buffer_local;
  Entry *this_local;
  
  cVar1 = Node::id(this->m_node);
  local_20 = vlenc_u64(cVar1,buffer);
  cVar1 = Node::attribute(this->m_node);
  if (cVar1 == 8) {
    sVar2 = Variant::pack(&this->m_value,buffer + local_20);
    local_20 = sVar2 + local_20;
  }
  return local_20;
}

Assistant:

size_t Entry::pack(unsigned char* buffer) const
{
    size_t pos = 0;
    pos += vlenc_u64(m_node->id(), buffer);
    if (m_node->attribute() == Attribute::NAME_ATTR_ID)
        pos += m_value.pack(buffer + pos);
    return pos;
}